

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

bool __thiscall
testing::internal::CartesianProductGenerator<const_char_*,_const_char_*>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::AtEnd
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false> _Var1;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
  _Var2;
  undefined1 uVar3;
  int iVar4;
  
  _Var1._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_char_*>,_testing::internal::ParamIterator<const_char_*>_>
       .super__Head_base<0UL,_testing::internal::ParamIterator<const_char_*>,_false>._M_head_impl.
       impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
       .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>.
       _M_head_impl;
  if (_Var1._M_head_impl !=
      ((ParamIteratorInterface<const_char_*> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_char_*>,_testing::internal::ParamIterator<const_char_*>_>
      .super__Head_base<0UL,_testing::internal::ParamIterator<const_char_*>,_false>._M_head_impl.
      impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>).
      _M_head_impl) {
    iVar4 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])();
    if ((char)iVar4 == '\0') {
      _Var2._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>.
      _M_head_impl = (this->current_).
                     super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_char_*>,_testing::internal::ParamIterator<const_char_*>_>
                     .super__Tuple_impl<1UL,_testing::internal::ParamIterator<const_char_*>_>.
                     super__Head_base<1UL,_testing::internal::ParamIterator<const_char_*>,_false>.
                     _M_head_impl.impl_._M_t.
                     super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
                     ._M_t;
      if ((_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>)
          _Var2._M_t.
          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
          .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>.
          _M_head_impl !=
          (_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>)
          *(_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
            *)&(this->end_).
               super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_char_*>,_testing::internal::ParamIterator<const_char_*>_>
               .super__Tuple_impl<1UL,_testing::internal::ParamIterator<const_char_*>_>.
               super__Head_base<1UL,_testing::internal::ParamIterator<const_char_*>,_false>.
               _M_head_impl.impl_._M_t.
               super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
         ) {
        uVar3 = (**(code **)(*(long *)_Var2._M_t.
                                      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
                                      .
                                      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>
                                      ._M_head_impl + 0x30))();
        return (bool)uVar3;
      }
    }
  }
  return true;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }